

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib579.c
# Opt level: O2

int progress_callback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)ultotal;
  iVar4 = (int)ulnow;
  if (((progress_callback::prev_ultotal != iVar3) ||
      (iVar1 = progress_callback::prev_ultotal, iVar2 = progress_callback::prev_ulnow,
      progress_callback::prev_ulnow != iVar4)) &&
     (__stream = fopen64(libtest_arg2,"ab"), iVar1 = iVar3, iVar2 = iVar4, __stream != (FILE *)0x0))
  {
    curl_mfprintf(__stream,"Progress callback called with UL %d out of %d\n",iVar4,iVar3);
    fclose(__stream);
  }
  progress_callback::prev_ulnow = iVar2;
  progress_callback::prev_ultotal = iVar1;
  return 0;
}

Assistant:

static int progress_callback(void *clientp, double dltotal, double dlnow,
                             double ultotal, double ulnow)
{
  static int prev_ultotal = -1;
  static int prev_ulnow = -1;
  (void)clientp; /* UNUSED */
  (void)dltotal; /* UNUSED */
  (void)dlnow; /* UNUSED */

  /* to avoid depending on timing, which will cause this progress function to
     get called a different number of times depending on circumstances, we
     only log these lines if the numbers are different from the previous
     invoke */
  if((prev_ultotal != (int)ultotal) ||
     (prev_ulnow != (int)ulnow)) {

    FILE *moo = fopen(libtest_arg2, "ab");
    if(moo) {
      fprintf(moo, "Progress callback called with UL %d out of %d\n",
              (int)ulnow, (int)ultotal);
      fclose(moo);
    }
    prev_ulnow = (int) ulnow;
    prev_ultotal = (int) ultotal;
  }
  return 0;
}